

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O1

int kwsysProcessCreate(cmsysProcess *cp,int prIndex,kwsysProcessCreateInformation *si)

{
  int iVar1;
  __pid_t __pid;
  __pid_t _Var2;
  ssize_t sVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  int *piVar7;
  char *__src;
  size_t __n;
  kwsysProcess_ssize_t total;
  ulong uVar8;
  uint uVar9;
  undefined4 uVar10;
  pid_t child_pid;
  int local_43c;
  _union_1457 local_438 [129];
  
  piVar7 = si->ErrorPipe;
  iVar1 = pipe(piVar7);
  if (iVar1 < 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    iVar1 = fcntl64(si->ErrorPipe[1],2,1);
    if (-1 < iVar1) {
      piVar5 = si->ErrorPipe + 1;
      iVar1 = cp->OptionDetach;
      __pid = fork();
      uVar10 = __pid;
      if (-1 < __pid && iVar1 != 0) {
        if (__pid == 0) {
          local_438[0]._0_4_ = fork();
          if (local_438[0]._0_4_ != 0) {
            do {
              sVar3 = write(*piVar5,local_438,4);
              if (-1 < sVar3) break;
              piVar7 = __errno_location();
            } while (*piVar7 == 4);
            _exit(0);
          }
          local_438[0]._0_4_ = 0;
          uVar10 = 0;
        }
        else {
          do {
            sVar3 = read(*piVar7,local_438,4);
            if (-1 < sVar3) break;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
          do {
            _Var2 = waitpid(__pid,&local_43c,0);
            uVar10 = local_438[0]._0_4_;
            if (-1 < _Var2) break;
            piVar4 = __errno_location();
            uVar10 = local_438[0]._0_4_;
          } while (*piVar4 == 4);
        }
      }
      cp->ForkPIDs[prIndex] = uVar10;
      if (-1 < (int)uVar10) {
        if (uVar10 == 0) {
          close(si->ErrorPipe[0]);
          iVar1 = si->StdIn;
          if (iVar1 < 1) {
            if (iVar1 < 0) {
              close(0);
            }
          }
          else {
            dup2(iVar1,0);
          }
          if (si->StdOut != 1) {
            dup2(si->StdOut,1);
          }
          if (si->StdErr != 2) {
            dup2(si->StdErr,2);
          }
          fcntl64(0,2,0);
          fcntl64(1,2,0);
          fcntl64(2,2,0);
          memset(local_438,0,0x98);
          sigaction(1,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(2,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(3,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(4,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(5,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(6,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(6,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(7,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(8,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(10,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0xb,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0xc,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0xd,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0xe,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0xf,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x10,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x11,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x11,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x12,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x14,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x15,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x16,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x17,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x18,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x19,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x1a,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x1b,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x1c,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x1d,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x1d,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x1e,(sigaction *)local_438,(sigaction *)0x0);
          sigaction(0x1f,(sigaction *)local_438,(sigaction *)0x0);
          execvp(*cp->Commands[prIndex],cp->Commands[prIndex]);
          iVar1 = *piVar5;
          piVar7 = __errno_location();
          __src = strerror(*piVar7);
          strncpy((char *)local_438,__src,0x400);
          __n = strlen((char *)local_438);
          write(iVar1,local_438,__n);
          _exit(1);
        }
        cp->CommandsLeft = cp->CommandsLeft + 1;
        kwsysProcessCleanupDescriptor(piVar5);
        uVar8 = 0;
        do {
          do {
            sVar3 = read(*piVar7,cp->ErrorMessage + uVar8,0x400 - uVar8);
            if (-1 < sVar3) break;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
          lVar6 = 0;
          if (0 < sVar3) {
            lVar6 = sVar3;
          }
          uVar8 = uVar8 + lVar6;
        } while ((uVar8 < 0x400) && (0 < sVar3));
        kwsysProcessCleanupDescriptor(piVar7);
        uVar9 = (uint)(uVar8 == 0);
      }
    }
  }
  return uVar9;
}

Assistant:

static int kwsysProcessCreate(kwsysProcess* cp, int prIndex,
                              kwsysProcessCreateInformation* si)
{
  /* Create the error reporting pipe.  */
  if(pipe(si->ErrorPipe) < 0)
    {
    return 0;
    }

  /* Set close-on-exec flag on the error pipe's write end.  */
  if(fcntl(si->ErrorPipe[1], F_SETFD, FD_CLOEXEC) < 0)
    {
    return 0;
    }

  /* Fork off a child process.  */
#if defined(__VMS)
  /* VMS needs vfork and execvp to be in the same function because
     they use setjmp/longjmp to run the child startup code in the
     parent!  TODO: OptionDetach.  */
  cp->ForkPIDs[prIndex] = vfork();
#else
  cp->ForkPIDs[prIndex] = kwsysProcessFork(cp, si);
#endif
  if(cp->ForkPIDs[prIndex] < 0)
    {
    return 0;
    }

  if(cp->ForkPIDs[prIndex] == 0)
    {
#if defined(__VMS)
    /* Specify standard pipes for child process.  */
    decc$set_child_standard_streams(si->StdIn, si->StdOut, si->StdErr);
#else
    /* Close the read end of the error reporting pipe.  */
    close(si->ErrorPipe[0]);

    /* Setup the stdin, stdout, and stderr pipes.  */
    if(si->StdIn > 0)
      {
      dup2(si->StdIn, 0);
      }
    else if(si->StdIn < 0)
      {
      close(0);
      }
    if(si->StdOut != 1)
      {
      dup2(si->StdOut, 1);
      }
    if(si->StdErr != 2)
      {
      dup2(si->StdErr, 2);
      }

    /* Clear the close-on-exec flag for stdin, stdout, and stderr.
       All other pipe handles will be closed when exec succeeds.  */
    fcntl(0, F_SETFD, 0);
    fcntl(1, F_SETFD, 0);
    fcntl(2, F_SETFD, 0);

    /* Restore all default signal handlers. */
    kwsysProcessRestoreDefaultSignalHandlers();
#endif

    /* Execute the real process.  If successful, this does not return.  */
    execvp(cp->Commands[prIndex][0], cp->Commands[prIndex]);
    /* TODO: What does VMS do if the child fails to start?  */

    /* Failure.  Report error to parent and terminate.  */
    kwsysProcessChildErrorExit(si->ErrorPipe[1]);
    }

#if defined(__VMS)
  /* Restore the standard pipes of this process.  */
  decc$set_child_standard_streams(0, 1, 2);
#endif

  /* A child has been created.  */
  ++cp->CommandsLeft;

  /* We are done with the error reporting pipe write end.  */
  kwsysProcessCleanupDescriptor(&si->ErrorPipe[1]);

  /* Block until the child's exec call succeeds and closes the error
     pipe or writes data to the pipe to report an error.  */
  {
  kwsysProcess_ssize_t total = 0;
  kwsysProcess_ssize_t n = 1;
  /* Read the entire error message up to the length of our buffer.  */
  while(total < KWSYSPE_PIPE_BUFFER_SIZE && n > 0)
    {
    /* Keep trying to read until the operation is not interrupted.  */
    while(((n = read(si->ErrorPipe[0], cp->ErrorMessage+total,
                     (size_t)(KWSYSPE_PIPE_BUFFER_SIZE-total))) < 0) &&
          (errno == EINTR));
    if(n > 0)
      {
      total += n;
      }
    }

  /* We are done with the error reporting pipe read end.  */
  kwsysProcessCleanupDescriptor(&si->ErrorPipe[0]);

  if(total > 0)
    {
    /* The child failed to execute the process.  */
    return 0;
    }
  }

  return 1;
}